

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O1

int32_t uregex_replaceFirst_63
                  (URegularExpression *regexp2,UChar *replacementText,int32_t replacementLength,
                  UChar *destBuf,int32_t destCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  RegularExpression *regexp;
  int32_t local_34;
  UChar *local_30;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((regexp2 != (URegularExpression *)0x0) && (*(int *)regexp2 == 0x72657870)) {
      if ((*(long *)(regexp2 + 0x30) == 0) && (regexp2[0x3c] == (URegularExpression)0x0)) {
        *status = U_REGEX_INVALID_STATE;
        return 0;
      }
      if (-2 < replacementLength && replacementText != (UChar *)0x0) {
        if ((-1 < destCapacity) && (destBuf != (UChar *)0x0 || destCapacity < 1)) {
          iVar2 = 0;
          local_34 = destCapacity;
          local_30 = destBuf;
          uregex_reset64_63(regexp2,0,status);
          UVar1 = uregex_find64_63(regexp2,0,status);
          if (UVar1 != '\0') {
            iVar2 = icu_63::RegexCImpl::appendReplacement
                              ((RegularExpression *)regexp2,replacementText,replacementLength,
                               &local_30,&local_34,status);
          }
          iVar3 = icu_63::RegexCImpl::appendTail
                            ((RegularExpression *)regexp2,&local_30,&local_34,status);
          return iVar3 + iVar2;
        }
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uregex_replaceFirst(URegularExpression  *regexp2,
                    const UChar         *replacementText,
                    int32_t              replacementLength,
                    UChar               *destBuf,
                    int32_t              destCapacity,
                    UErrorCode          *status)  {
    RegularExpression *regexp = (RegularExpression*)regexp2;
    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }
    if (replacementText == NULL || replacementLength < -1 ||
        (destBuf == NULL && destCapacity > 0) ||
        destCapacity < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    int32_t   len = 0;
    UBool     findSucceeded;
    uregex_reset(regexp2, 0, status);
    findSucceeded = uregex_find(regexp2, 0, status);
    if (findSucceeded) {
        len = uregex_appendReplacement(regexp2, replacementText, replacementLength,
                                       &destBuf, &destCapacity, status);
    }
    len += uregex_appendTail(regexp2, &destBuf, &destCapacity, status);

    return len;
}